

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testReadDoubleTwoStep(DataFileTest *this)

{
  int iVar1;
  auto_ptr<avro::DataFileReaderBase> this_00;
  ssize_t sVar2;
  double *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  element_type *__tmp;
  readonly_property<bool> rVar3;
  bool bVar4;
  check_is_close_t local_161;
  DataFileReader<Complex<double>_> df;
  string *local_158;
  string *local_150;
  string local_148;
  DataFileReader<Complex<double>_> *local_128;
  int i;
  string local_118;
  lazy_ostream local_f8;
  undefined8 *local_e8;
  size_type **local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  string **local_c0;
  undefined **local_b8;
  undefined1 local_b0;
  undefined8 *local_a8;
  string **local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  double im;
  double re;
  undefined1 local_80 [16];
  shared_count sStack_70;
  ComplexDouble ci;
  undefined1 local_58 [8];
  auto_ptr<avro::DataFileReaderBase> base;
  size_type *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  auto_ptr<avro::DataFileReaderBase> local_38;
  
  this_00._M_ptr = (DataFileReaderBase *)operator_new(0xe0);
  avro::DataFileReaderBase::DataFileReaderBase(this_00._M_ptr,this->filename);
  base._M_ptr = (DataFileReaderBase *)0x0;
  local_38._M_ptr = (DataFileReaderBase *)0x0;
  df.base_._M_ptr =
       (auto_ptr<avro::DataFileReaderBase>)(auto_ptr<avro::DataFileReaderBase>)this_00._M_ptr;
  avro::DataFileReaderBase::init();
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&local_38);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x16e;
  local_f8.m_empty = false;
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_001b9fb8;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b9fb8;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = (size_type **)0x196ac0;
  toString_abi_cxx11_(&local_148,&this->writerSchema);
  toString_abi_cxx11_(&local_118,(ValidSchema *)((long)df.base_._M_ptr + 0x48));
  if (local_148._M_string_length == local_118._M_string_length) {
    if (local_148._M_string_length == 0) {
      rVar3.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar1 = bcmp(local_148._M_dataplus._M_p,local_118._M_dataplus._M_p,local_148._M_string_length)
      ;
      rVar3.super_class_property<bool>.value = (class_property<bool>)(iVar1 == 0);
    }
  }
  else {
    rVar3.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_80[0] = rVar3.super_class_property<bool>.value;
  local_80._8_8_ = (element_type *)0x0;
  sStack_70.pi_ = (sp_counted_base *)0x0;
  ci.re = (double)anon_var_dwarf_a156a;
  ci.im = (double)((long)
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                  + 0x70);
  local_a0 = &local_158;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_001ba258;
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_150;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_001ba258;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &local_148;
  local_150 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,&local_f8,(const_string *)&ci,0x16e,CHECK,CHECK_EQUAL,2,
             "toString(writerSchema)",&local_b8,"toString(df.readerSchema())",&local_d8);
  boost::detail::shared_count::~shared_count(&sStack_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x16f;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)local_98;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = (size_type **)0x196ac0;
  toString_abi_cxx11_(&local_148,&this->writerSchema);
  toString_abi_cxx11_(&local_118,(ValidSchema *)((long)df.base_._M_ptr + 0x58));
  if (local_148._M_string_length == local_118._M_string_length) {
    if (local_148._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp(local_148._M_dataplus._M_p,local_118._M_dataplus._M_p,local_148._M_string_length)
      ;
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  local_80[0] = bVar4;
  local_80._8_8_ = (element_type *)0x0;
  sStack_70.pi_ = (sp_counted_base *)0x0;
  ci.re = (double)anon_var_dwarf_a156a;
  ci.im = (double)((long)
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                  + 0x70);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_001ba258;
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_158;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_001ba258;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_150;
  local_158 = &local_148;
  local_150 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,&local_f8,(const_string *)&ci,0x16f,CHECK,CHECK_EQUAL,2,
             "toString(writerSchema)",&local_b8,"toString(df.dataSchema())",&local_d8);
  boost::detail::shared_count::~shared_count(&sStack_70);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_01;
  }
  i = 0;
  ci.re = 0.0;
  ci.im = 0.0;
  re = 3.0;
  __nbytes = &im;
  im = 5.0;
  local_128 = &df;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&PTR__lazy_ostream_001ba218;
  while( true ) {
    sVar2 = avro::DataFileReader<Complex<double>_>::read(&df,(int)&ci,__buf,(size_t)__nbytes);
    if ((char)sVar2 == '\0') break;
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x175;
    local_148._M_string_length = local_148._M_string_length & 0xffffffffffffff00;
    local_148._M_dataplus._M_p = (pointer)local_98;
    local_148.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_148.field_2._8_8_ = (long)"\t" + 1;
    local_58 = (undefined1  [8])0x3f1a36e2eb1c432d;
    boost::test_tools::check_is_close_t::operator()
              ((assertion_result *)&local_118,&local_161,ci.re,re,
               (percent_tolerance_t<double>)0x3f1a36e2eb1c432d);
    local_80._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_80._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
         + 0x70;
    local_158 = (string *)&ci;
    local_b0 = 0;
    local_b8 = &PTR__lazy_ostream_001ba1d8;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_158;
    local_150 = (string *)&re;
    local_d0 = 0;
    local_d8 = &PTR__lazy_ostream_001ba1d8;
    local_c8 = &boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_150;
    local_48 = (size_type *)local_58;
    local_f8.m_empty = false;
    local_f8._vptr_lazy_ostream = (_func_int **)local_40;
    local_e8 = &boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_48;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)&local_148,(const_string *)local_80,
               0x175,CHECK,CHECK_CLOSE,3,"ci.re",&local_b8,"re",&local_d8,
               "::boost::math::fpc::percent_tolerance(0.0001)",&local_f8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_118.field_2._M_allocated_capacity);
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x176;
    local_148._M_string_length = local_148._M_string_length & 0xffffffffffffff00;
    local_148._M_dataplus._M_p = (pointer)local_98;
    local_148.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_148.field_2._8_8_ = (long)"\t" + 1;
    local_58 = (undefined1  [8])0x3f1a36e2eb1c432d;
    boost::test_tools::check_is_close_t::operator()
              ((assertion_result *)&local_118,&local_161,ci.im,im,
               (percent_tolerance_t<double>)0x3f1a36e2eb1c432d);
    local_80._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_80._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
         + 0x70;
    local_158 = (string *)&ci.im;
    local_b0 = 0;
    local_b8 = &PTR__lazy_ostream_001ba1d8;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_158;
    local_150 = (string *)&im;
    local_d0 = 0;
    local_d8 = &PTR__lazy_ostream_001ba1d8;
    local_c8 = &boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_150;
    local_48 = (size_type *)local_58;
    local_f8.m_empty = false;
    local_f8._vptr_lazy_ostream = (_func_int **)local_40;
    local_e8 = &boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_48;
    __nbytes = (double *)0x176;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)&local_148,(const_string *)local_80,
               0x176,CHECK,CHECK_CLOSE,3,"ci.im",&local_b8,"im",&local_d8,
               "::boost::math::fpc::percent_tolerance(0.0001)",&local_f8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_118.field_2._M_allocated_capacity);
    re = im + -0.7 + re;
    im = im + 3.1;
    i = i + 1;
    __buf = extraout_RDX_02;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x17b;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)local_98;
  local_80._0_8_ = &i;
  local_148._M_dataplus._M_p._0_1_ = i == 1000;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = (size_type **)0x196ac0;
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  local_118._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_118._M_string_length = 0x1973d3;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_001b9ff8;
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = (string **)local_80;
  local_158 = (string *)&count;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_001b9ff8;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,&local_f8,(const_string *)&local_118,0x17b,CHECK,
             CHECK_EQUAL,2,"i",&local_b8,"count",&local_d8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_148.field_2._M_allocated_capacity);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df.base_);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&base);
  return;
}

Assistant:

void testReadDoubleTwoStep() {
        auto_ptr<avro::DataFileReaderBase>
            base(new avro::DataFileReaderBase(filename));
        avro::DataFileReader<ComplexDouble> df(base);
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.readerSchema()));
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.dataSchema()));
        int i = 0;
        ComplexDouble ci;
        double re = 3.0;
        double im = 5.0;
        while (df.read(ci)) {
            BOOST_CHECK_CLOSE(ci.re, re, 0.0001);
            BOOST_CHECK_CLOSE(ci.im, im, 0.0001);
            re += (im - 0.7);
            im += 3.1;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }